

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

void __thiscall pybind11::dtype::dtype(dtype *this,buffer_info *info)

{
  PyObject **ppPVar1;
  long in_RSI;
  undefined8 *in_RDI;
  object *in_stack_00000018;
  dtype *in_stack_00000020;
  dtype descr;
  ssize_t in_stack_000001f0;
  dtype *in_stack_000001f8;
  object *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff98;
  str *in_stack_ffffffffffffffa0;
  handle local_48;
  str *in_stack_ffffffffffffffc0;
  object_api<pybind11::handle> *in_stack_ffffffffffffffc8;
  
  object::object((object *)0x199b5d);
  _dtype_from_pep3118();
  str::str(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  detail::object_api<pybind11::handle>::operator()
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  dtype(in_stack_00000020,in_stack_00000018);
  object::~object((object *)0x199baf);
  str::~str((str *)0x199bb9);
  object::~object((object *)0x199bc3);
  if (*(long *)(in_RSI + 8) == 0) {
    itemsize((dtype *)0x199be9);
  }
  strip_padding(in_stack_000001f8,in_stack_000001f0);
  local_48 = object::release(in_stack_ffffffffffffff88);
  ppPVar1 = pybind11::handle::ptr(&local_48);
  *in_RDI = *ppPVar1;
  ~dtype((dtype *)0x199c4f);
  ~dtype((dtype *)0x199c59);
  return;
}

Assistant:

explicit dtype(const buffer_info &info) {
        dtype descr(_dtype_from_pep3118()(PYBIND11_STR_TYPE(info.format)));
        // If info.itemsize == 0, use the value calculated from the format string
        m_ptr = descr.strip_padding(info.itemsize ? info.itemsize : descr.itemsize()).release().ptr();
    }